

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPrintVisitor.cpp
# Opt level: O0

void __thiscall CPrintVisitor::Visit(CPrintVisitor *this,CCallMethodExp *exp)

{
  initializer_list<INode_*> __l;
  allocator local_109;
  string local_108 [32];
  ChildrenAnswers local_e8;
  vector<INode_*,_std::allocator<INode_*>_> local_b8;
  undefined1 local_a0 [8];
  ChildrenAnswers answers;
  allocator<INode_*> local_59;
  pointer local_58;
  pointer local_50;
  pointer local_48;
  pointer *local_40;
  size_type local_38;
  undefined1 local_30 [8];
  vector<INode_*,_std::allocator<INode_*>_> children;
  CCallMethodExp *exp_local;
  CPrintVisitor *this_local;
  
  children.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)exp;
  local_58 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::get
                       (&exp->objectExpression);
  local_50 = std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::get
                       ((unique_ptr<CIdExp,_std::default_delete<CIdExp>_> *)
                        (children.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 4));
  local_48 = std::unique_ptr<CExpList,_std::default_delete<CExpList>_>::get
                       ((unique_ptr<CExpList,_std::default_delete<CExpList>_> *)
                        (children.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 5));
  local_40 = &local_58;
  local_38 = 3;
  std::allocator<INode_*>::allocator(&local_59);
  __l._M_len = local_38;
  __l._M_array = (iterator)local_40;
  std::vector<INode_*,_std::allocator<INode_*>_>::vector
            ((vector<INode_*,_std::allocator<INode_*>_> *)local_30,__l,&local_59);
  std::allocator<INode_*>::~allocator(&local_59);
  std::vector<INode_*,_std::allocator<INode_*>_>::vector
            (&local_b8,(vector<INode_*,_std::allocator<INode_*>_> *)local_30);
  VisitChildren((ChildrenAnswers *)local_a0,this,&local_b8);
  std::vector<INode_*,_std::allocator<INode_*>_>::~vector(&local_b8);
  ChildrenAnswers::ChildrenAnswers(&local_e8,(ChildrenAnswers *)local_a0);
  AddChildrenAnswers(this,(ChildrenAnswers *)&local_e8);
  ChildrenAnswers::~ChildrenAnswers(&local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"CallMethod",&local_109);
  AddLabel(this,(string *)local_108);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  this->lastVisited = this->lastVisited + 1;
  ChildrenAnswers::~ChildrenAnswers((ChildrenAnswers *)local_a0);
  std::vector<INode_*,_std::allocator<INode_*>_>::~vector
            ((vector<INode_*,_std::allocator<INode_*>_> *)local_30);
  return;
}

Assistant:

void CPrintVisitor::Visit(CCallMethodExp &exp)
{
	std::vector<INode*> children = { exp.objectExpression.get(), exp.methodName.get(), exp.args.get() };
	ChildrenAnswers answers = VisitChildren(children);
	AddChildrenAnswers(answers);
	AddLabel("CallMethod");
	++lastVisited;	
}